

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O2

void do_jobs(pmtr_t *cfg)

{
  UT_array *pUVar1;
  job_t *pjVar2;
  __rlimit_resource_t *p_Var3;
  char **__argv;
  __pid_t _Var4;
  int iVar5;
  time_t tVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  passwd *ppVar10;
  char *pcVar11;
  __rlimit_resource_t *p_Var12;
  char *__fmt;
  ulong uVar13;
  ulong uVar14;
  char *filename;
  char *filename_00;
  job_t *job;
  long lVar15;
  int es;
  time_t now;
  rlimit local_c8;
  sigset_t none;
  
  job = (job_t *)0x0;
  while( true ) {
    while( true ) {
      do {
        while( true ) {
          pUVar1 = cfg->jobs;
          uVar14 = (ulong)pUVar1->i;
          if (job == (job_t *)0x0) {
            if (uVar14 == 0) {
              return;
            }
            job = (job_t *)pUVar1->d;
          }
          else {
            pjVar2 = (job_t *)pUVar1->d;
            if (job < pjVar2) {
              if (uVar14 == 0) {
                return;
              }
              uVar13 = (pUVar1->icd).sz;
              uVar9 = 0;
            }
            else {
              uVar13 = (pUVar1->icd).sz;
              uVar9 = (ulong)((long)job - (long)pjVar2) / uVar13 + 1;
              if (uVar14 <= uVar9) {
                return;
              }
            }
            job = (job_t *)((long)&pjVar2->name + uVar13 * uVar9);
          }
          if (job == (job_t *)0x0) {
            return;
          }
          if ((((job->bounce_interval != 0) && (job->pid != 0)) &&
              (now = time((time_t *)0x0), (long)job->bounce_interval <= now - job->start_ts)) &&
             (job->terminate == 0)) {
            job->terminate = 1;
          }
          if (job->terminate == 0) break;
          signal_job(job);
        }
      } while (((job->disabled != 0) || (job->pid != 0)) || (job->respawn == 0));
      lVar15 = job->start_at;
      tVar6 = time(&now);
      if (lVar15 <= tVar6) break;
      alarm_within(cfg,(int)job->start_at - (int)now);
    }
    _Var4 = fork();
    if (_Var4 == -1) {
      syslog(3,"fork error\n");
      _Var4 = getpid();
      kill(_Var4,0xf);
      return;
    }
    if (_Var4 < 1) break;
    job->pid = _Var4;
    tVar6 = time((time_t *)0x0);
    job->start_ts = tVar6;
    syslog(6,"started job %s [%d]",job->name);
    if (job->wait != 0) {
      syslog(6,"pausing for job %s to finish",job->name);
      _Var4 = waitpid(job->pid,&es,0);
      if (_Var4 == job->pid) {
        syslog(6,"job %s finished",job->name);
        if (((es & 0xff7fU) == 0x2100) || (job->once != 0)) {
          job->respawn = 0;
        }
        job->pid = 0;
      }
      else {
        syslog(3,"waitpid for job %s failed\n",job->name);
      }
    }
  }
  if (_Var4 != 0) {
    __assert_fail("pid == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/job.c",
                  0x25a,"void do_jobs(pmtr_t *)");
  }
  if ((job->dir == (char *)0x0) || (iVar5 = chdir(job->dir), iVar5 != -1)) {
    closelog();
    pcVar11 = (char *)0x0;
    do {
      uVar14 = (ulong)(job->envv).i;
      if (pcVar11 == (char *)0x0) {
        if (uVar14 == 0) goto LAB_00105454;
        pcVar11 = (job->envv).d;
      }
      else {
        pcVar8 = (job->envv).d;
        if (pcVar11 < pcVar8) {
          if (uVar14 == 0) goto LAB_00105454;
          uVar13 = (job->envv).icd.sz;
          uVar9 = 0;
        }
        else {
          uVar13 = (job->envv).icd.sz;
          uVar9 = (ulong)((long)pcVar11 - (long)pcVar8) / uVar13 + 1;
          if (uVar14 <= uVar9) goto LAB_00105454;
        }
        pcVar11 = pcVar8 + uVar13 * uVar9;
      }
      if (pcVar11 == (char *)0x0) goto LAB_00105454;
      putenv(*(char **)pcVar11);
    } while( true );
  }
  pcVar11 = job->dir;
  piVar7 = __errno_location();
  pcVar8 = strerror(*piVar7);
  __fmt = "can\'t chdir %s: %s";
LAB_001053c7:
  syslog(3,__fmt,pcVar11,pcVar8);
  goto LAB_0010563a;
LAB_00105454:
  iVar5 = setpriority(PRIO_PROCESS,0,job->nice);
  if (iVar5 < 0) {
    piVar7 = __errno_location();
    pcVar11 = strerror(*piVar7);
    pcVar8 = "can\'t setpriority: %s";
  }
  else {
    iVar5 = __sched_cpucount(0x80,(cpu_set_t *)&job->cpuset);
    if ((iVar5 < 1) || (iVar5 = sched_setaffinity(0,0x80,(cpu_set_t *)&job->cpuset), iVar5 == 0)) {
      p_Var12 = (__rlimit_resource_t *)0x0;
      do {
        uVar14 = (ulong)(job->rlim).i;
        if (p_Var12 != (__rlimit_resource_t *)0x0) {
          p_Var3 = (__rlimit_resource_t *)(job->rlim).d;
          if (p_Var12 < p_Var3) {
            if (uVar14 != 0) {
              uVar13 = (job->rlim).icd.sz;
              uVar9 = 0;
LAB_00105504:
              p_Var12 = (__rlimit_resource_t *)((long)p_Var3 + uVar13 * uVar9);
              goto LAB_0010550e;
            }
          }
          else {
            uVar13 = (job->rlim).icd.sz;
            uVar9 = (ulong)((long)p_Var12 - (long)p_Var3) / uVar13 + 1;
            if (uVar9 < uVar14) goto LAB_00105504;
          }
LAB_00105546:
          for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 4) {
            signal(*(int *)((long)sigs + lVar15),(__sighandler_t)0x0);
          }
          sigemptyset((sigset_t *)&none);
          sigprocmask(2,(sigset_t *)&none,(sigset_t *)0x0);
          if (job->user[0] != '\0') {
            pcVar11 = job->user;
            ppVar10 = getpwnam(pcVar11);
            if (ppVar10 != (passwd *)0x0) {
              iVar5 = setgid(ppVar10->pw_gid);
              if (iVar5 == -1) {
                piVar7 = __errno_location();
                pcVar8 = strerror(*piVar7);
                __fmt = "can\'t setgid %s: %s";
              }
              else {
                iVar5 = initgroups(pcVar11,ppVar10->pw_gid);
                if (iVar5 == -1) {
                  piVar7 = __errno_location();
                  pcVar8 = strerror(*piVar7);
                  __fmt = "can\'t initgroups %s: %s";
                }
                else {
                  iVar5 = setuid(ppVar10->pw_uid);
                  if (iVar5 != -1) goto LAB_0010558b;
                  piVar7 = __errno_location();
                  pcVar8 = strerror(*piVar7);
                  __fmt = "can\'t setuid %s: %s";
                }
              }
              goto LAB_001053c7;
            }
            pcVar8 = "unknown user: %s";
            goto LAB_00105633;
          }
LAB_0010558b:
          filename_00 = "/dev/null";
          if (job->in != (char *)0x0) {
            filename_00 = job->in;
          }
          filename = job->out;
          if (filename == (char *)0x0) {
            filename = "syslog";
          }
          pcVar11 = job->err;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "syslog";
          }
          iVar5 = redirect(cfg,0,filename_00,0,0);
          if (iVar5 < 0) {
            piVar7 = __errno_location();
            pcVar8 = strerror(*piVar7);
            __fmt = "can\'t open/dup %s: %s";
            pcVar11 = filename_00;
          }
          else {
            iVar5 = redirect(cfg,1,filename,0x441,0x1a4);
            if (iVar5 < 0) {
              piVar7 = __errno_location();
              pcVar8 = strerror(*piVar7);
              __fmt = "can\'t open/dup %s: %s";
              pcVar11 = filename;
            }
            else {
              iVar5 = redirect(cfg,2,pcVar11,0x441,0x1a4);
              if (iVar5 < 0) {
                piVar7 = __errno_location();
                pcVar8 = strerror(*piVar7);
                __fmt = "can\'t open/dup %s: %s";
              }
              else {
                __argv = (char **)(job->cmdv).d;
                pcVar11 = *__argv;
                iVar5 = execv(pcVar11,__argv);
                if (iVar5 != -1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/job.c"
                                ,0x294,"void do_jobs(pmtr_t *)");
                }
                piVar7 = __errno_location();
                pcVar8 = strerror(*piVar7);
                __fmt = "can\'t exec %s: %s";
              }
            }
          }
          goto LAB_001053c7;
        }
        if (uVar14 == 0) goto LAB_00105546;
        p_Var12 = (__rlimit_resource_t *)(job->rlim).d;
LAB_0010550e:
        if (p_Var12 == (__rlimit_resource_t *)0x0) goto LAB_00105546;
        local_c8.rlim_cur = *(rlim_t *)(p_Var12 + 2);
        local_c8.rlim_max = *(rlim_t *)(p_Var12 + 4);
        iVar5 = setrlimit(*p_Var12,&local_c8);
      } while (iVar5 == 0);
      piVar7 = __errno_location();
      pcVar11 = strerror(*piVar7);
      pcVar8 = "can\'t setrlimit: %s";
    }
    else {
      piVar7 = __errno_location();
      pcVar11 = strerror(*piVar7);
      pcVar8 = "can\'t set cpu affinity: %s";
    }
  }
LAB_00105633:
  syslog(3,pcVar8,pcVar11);
LAB_0010563a:
  exit(-1);
}

Assistant:

void do_jobs(pmtr_t *cfg) {
  pid_t pid;
  time_t now, elapsed;
  int es, n, fo, fe, fi, rc=-1, ds;
  char *pathname, *o, *e, *i, **argv, **env;

  job_t *job = NULL;
  while ( (job = (job_t*)utarray_next(cfg->jobs,job))) {
    if (job->bounce_interval && job->pid) { 
      now = time(NULL);
      elapsed = now - job->start_ts;
      if (elapsed >= job->bounce_interval) {
        if (job->terminate==0) job->terminate=1;
      }
    }
    if (job->terminate) {signal_job(job); continue;}
    if (job->disabled) continue;
    if (job->pid) continue;  /* running already */
    if (job->respawn == 0) continue;  /* don't respawn */
    if (job->start_at > time(&now)) {  /* not yet */
      alarm_within(cfg, job->start_at - now);
      continue;
    }

    pid = fork();

    if (pid == -1) {
      syslog(LOG_ERR,"fork error\n");
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      return;
    }

    if (pid > 0) {  /* parent */
      job->pid = pid;
      job->start_ts = time(NULL);
      syslog(LOG_INFO,"started job %s [%d]", job->name, (int)job->pid);
      /* support the 'wait' feature which pauses (blocks) for a job to finish.*/
      if (job->wait) {
        syslog(LOG_INFO,"pausing for job %s to finish",job->name);
        if (waitpid(job->pid, &es, 0) != job->pid) {
          syslog(LOG_ERR,"waitpid for job %s failed\n",job->name);
          continue;
        }
        syslog(LOG_INFO,"job %s finished",job->name);
        if (WIFEXITED(es) && (WEXITSTATUS(es) == PMTR_NO_RESTART)) job->respawn=0;
        else if (job->once) job->respawn=0;
        job->pid = 0;
      }
      continue;
    }

    /*********************************************************************
     * child here 
     ********************************************************************/
    assert(pid == 0);

    /* setup working dir */
    if (job->dir && (chdir(job->dir) == -1))                 {rc=-1; goto fail;}

    /* close inherited descriptors */
    closelog(); 

    /* set environment variables */
    env=NULL;
    while ( (env=(char**)utarray_next(&job->envv,env))) putenv(*env);

    /* set process priority / nice */
    if (setpriority(PRIO_PROCESS, 0, job->nice) < 0)         {rc=-5; goto fail;}

    /* set cpu affinity, if any */
    if ((CPU_COUNT(&job->cpuset) > 0) &&
      sched_setaffinity(0, sizeof(cpu_set_t), &job->cpuset)) {rc=-12; goto fail;}

    /* set ulimits */
    resource_rlimit_t *rt=NULL;
    while ( (rt=(resource_rlimit_t*)utarray_next(&job->rlim,rt))) {
      struct rlimit new_limit = {.rlim_cur=rt->rlim.rlim_cur,
                                 .rlim_max=rt->rlim.rlim_max};
      if (setrlimit(rt->id, &new_limit))                     {rc=-6; goto fail;}
    }

    /* restore/unblock default handlers so they're unblocked after exec */
    for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) signal(sigs[n], SIG_DFL);
    sigset_t none;
    sigemptyset(&none);
    sigprocmask(SIG_SETMASK,&none,NULL);

    /* change the real and effective user ids, and set the gid and supp groups */
    if (*job->user) {
      struct passwd *p;
      if ( (p = getpwnam(job->user)) == NULL)                {rc=-7; goto fail;}
      if (setgid(p->pw_gid) == -1)                           {rc=-8; goto fail;}
      if (initgroups(job->user, p->pw_gid) == -1)            {rc=-9; goto fail;}
      if (setuid(p->pw_uid) == -1)                           {rc=-10; goto fail;}
    }

    /* redirect the child's stdout and stderr to syslog unless user specified */
    i = job->in  ? job->in  : "/dev/null";
    o = job->out ? job->out : "syslog";
    e = job->err ? job->err : "syslog";

    int flags_wr = O_WRONLY|O_CREAT|O_APPEND;
    if (redirect(cfg, STDIN_FILENO,  i, O_RDONLY, 0)    < 0) { rc=-2; goto fail;}
    if (redirect(cfg, STDOUT_FILENO, o, flags_wr, 0644) < 0) { rc=-3; goto fail;}
    if (redirect(cfg, STDERR_FILENO, e, flags_wr, 0644) < 0) { rc=-4; goto fail;}

    /* at last. we're ready to run the child process */
    argv = (char**)utarray_front(&job->cmdv);
    pathname = *argv;
    if (execv(pathname, argv) == -1)                         {rc=-11; goto fail;}

    /* not reached - child has exec'd */
    assert(0); 

   fail:
    if (rc==-1) syslog(LOG_ERR,"can't chdir %s: %s", job->dir, strerror(errno));
    if (rc==-2) syslog(LOG_ERR,"can't open/dup %s: %s", i, strerror(errno));
    if (rc==-3) syslog(LOG_ERR,"can't open/dup %s: %s", o, strerror(errno));
    if (rc==-4) syslog(LOG_ERR,"can't open/dup %s: %s", e, strerror(errno));
    if (rc==-5) syslog(LOG_ERR,"can't setpriority: %s", strerror(errno));
    if (rc==-6) syslog(LOG_ERR,"can't setrlimit: %s", strerror(errno));
    if (rc==-7) syslog(LOG_ERR,"unknown user: %s", job->user);
    if (rc==-8) syslog(LOG_ERR,"can't setgid %s: %s", job->user, strerror(errno));
    if (rc==-9) syslog(LOG_ERR,"can't initgroups %s: %s", job->user, strerror(errno));
    if (rc==-10) syslog(LOG_ERR,"can't setuid %s: %s", job->user, strerror(errno));
    if (rc==-11) syslog(LOG_ERR,"can't exec %s: %s", pathname, strerror(errno));
    if (rc==-12) syslog(LOG_ERR,"can't set cpu affinity: %s", strerror(errno));
    exit(-1);  /* child exit */
  }
}